

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O3

OPJ_BOOL opj_alloc_tile_component_data(opj_tcd_tilecomp_t *l_tilec)

{
  bool bVar1;
  OPJ_INT32 *pOVar2;
  
  if (l_tilec->data != (OPJ_INT32 *)0x0) {
    if (l_tilec->data_size_needed <= l_tilec->data_size) {
      return 1;
    }
    if (l_tilec->ownsData != 0) {
      opj_image_data_free(l_tilec->data);
      pOVar2 = (OPJ_INT32 *)opj_image_data_alloc(l_tilec->data_size_needed);
      l_tilec->data = pOVar2;
      if (pOVar2 != (OPJ_INT32 *)0x0) {
        l_tilec->data_size = l_tilec->data_size_needed;
        l_tilec->ownsData = 1;
        return 1;
      }
      l_tilec->ownsData = 0;
      l_tilec->data_size_needed = 0;
      l_tilec->data_size = 0;
      return 0;
    }
  }
  pOVar2 = (OPJ_INT32 *)opj_image_data_alloc(l_tilec->data_size_needed);
  l_tilec->data = pOVar2;
  bVar1 = l_tilec->data_size_needed == 0 || pOVar2 != (OPJ_INT32 *)0x0;
  if (bVar1) {
    l_tilec->data_size = l_tilec->data_size_needed;
    l_tilec->ownsData = 1;
  }
  return (uint)bVar1;
}

Assistant:

OPJ_BOOL opj_alloc_tile_component_data(opj_tcd_tilecomp_t *l_tilec)
{
    if ((l_tilec->data == 00) ||
            ((l_tilec->data_size_needed > l_tilec->data_size) &&
             (l_tilec->ownsData == OPJ_FALSE))) {
        l_tilec->data = (OPJ_INT32 *) opj_image_data_alloc(l_tilec->data_size_needed);
        if (!l_tilec->data && l_tilec->data_size_needed != 0) {
            return OPJ_FALSE;
        }
        /*fprintf(stderr, "tAllocate data of tilec (int): %d x OPJ_UINT32n",l_data_size);*/
        l_tilec->data_size = l_tilec->data_size_needed;
        l_tilec->ownsData = OPJ_TRUE;
    } else if (l_tilec->data_size_needed > l_tilec->data_size) {
        /* We don't need to keep old data */
        opj_image_data_free(l_tilec->data);
        l_tilec->data = (OPJ_INT32 *) opj_image_data_alloc(l_tilec->data_size_needed);
        if (! l_tilec->data) {
            l_tilec->data_size = 0;
            l_tilec->data_size_needed = 0;
            l_tilec->ownsData = OPJ_FALSE;
            return OPJ_FALSE;
        }
        /*fprintf(stderr, "tReallocate data of tilec (int): from %d to %d x OPJ_UINT32n", l_tilec->data_size, l_data_size);*/
        l_tilec->data_size = l_tilec->data_size_needed;
        l_tilec->ownsData = OPJ_TRUE;
    }
    return OPJ_TRUE;
}